

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  local_search *this;
  long in_RSI;
  local_search A;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rows;
  ifstream infile;
  value_type *in_stack_fffffffffffffd38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd88;
  local_search *in_stack_fffffffffffffd90;
  string local_250 [56];
  istream local_218 [532];
  int local_4;
  
  local_4 = 0;
  std::ifstream::ifstream(local_218,*(undefined8 *)(in_RSI + 8),8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x10a44c);
  std::__cxx11::string::string(local_250);
  while( true ) {
    this = (local_search *)
           std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_250);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&(this->M).H.sigma.val +
                              *(long *)((this->M).H.sigma.val - 0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  }
  cvs_rk::local_search::local_search(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  cvs_rk::local_search::~local_search(this);
  std::__cxx11::string::~string(local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffd40);
  std::ifstream::~ifstream(local_218);
  return local_4;
}

Assistant:

int main(int argc,char** argv) {//this_is_a_test

	std::ifstream infile(argv[1]);

	vector<string> rows;

	std::string line;
	while (std::getline(infile, line)) rows.push_back(line);

	auto A = local_search(rows);

}